

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O2

void duckdb::BitpackingScanPartial<duckdb::uhugeint_t,duckdb::hugeint_t,duckdb::uhugeint_t>
               (ColumnSegment *segment,ColumnScanState *state,idx_t scan_count,Vector *result,
               idx_t result_offset)

{
  uhugeint_t *this;
  BitpackingMode BVar1;
  byte width;
  data_ptr_t pdVar2;
  uint64_t uVar3;
  uhugeint_t *puVar4;
  bool bVar5;
  BitpackingScanState<duckdb::uhugeint_t,_duckdb::hugeint_t> *this_00;
  long lVar6;
  ulong uVar7;
  long lVar8;
  idx_t iVar9;
  uint uVar10;
  ulong uVar11;
  uint64_t *puVar12;
  uhugeint_t *out;
  uhugeint_t uVar13;
  hugeint_t hVar14;
  hugeint_t frame_of_reference;
  hugeint_t previous_value;
  uhugeint_t local_b8;
  uhugeint_t *local_a0;
  data_ptr_t local_98;
  ulong local_90;
  uhugeint_t local_88;
  uhugeint_t *local_70;
  long local_68;
  data_ptr_t local_60;
  uhugeint_t local_58;
  uhugeint_t local_40;
  size_t size;
  
  this_00 = (BitpackingScanState<duckdb::uhugeint_t,_duckdb::hugeint_t> *)
            unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>
            ::operator->(&state->scan_state);
  pdVar2 = result->data;
  Vector::SetVectorType(result,FLAT_VECTOR);
  local_98 = pdVar2 + result_offset * 0x10;
  this = &this_00->current_frame_of_reference;
  local_a0 = this_00->decompression_buffer;
  local_70 = &this_00->current_delta_offset;
  local_60 = pdVar2 + result_offset * 0x10 + 8;
  lVar8 = scan_count << 4;
  local_68 = lVar8;
  for (local_90 = 0; uVar11 = scan_count - local_90, local_90 <= scan_count && uVar11 != 0;
      local_90 = local_90 + uVar7) {
    iVar9 = this_00->current_group_offset;
    if (iVar9 == 0x800) {
      BitpackingScanState<duckdb::uhugeint_t,_duckdb::hugeint_t>::LoadNextGroup(this_00);
      iVar9 = this_00->current_group_offset;
    }
    BVar1 = (this_00->current_group).mode;
    if (BVar1 == CONSTANT_DELTA) {
      uVar7 = 0x800 - iVar9;
      if (uVar11 < 0x800 - iVar9) {
        uVar7 = uVar11;
      }
      puVar12 = (uint64_t *)(local_60 + local_90 * 0x10);
      for (uVar11 = 0; uVar7 != uVar11; uVar11 = uVar11 + 1) {
        local_88.lower = (this_00->current_constant).lower;
        local_88.upper = (this_00->current_constant).upper;
        uhugeint_t::uhugeint_t(&local_40,this_00->current_group_offset + uVar11);
        local_b8 = uhugeint_t::operator*(&local_88,&local_40);
        local_58.lower = this->lower;
        local_58.upper = (this_00->current_frame_of_reference).upper;
        uVar13 = uhugeint_t::operator+(&local_b8,&local_58);
        puVar12[-1] = uVar13.lower;
        *puVar12 = uVar13.upper;
        puVar12 = puVar12 + 2;
      }
      iVar9 = this_00->current_group_offset + uVar7;
      lVar8 = local_68;
    }
    else {
      if (BVar1 == CONSTANT) {
        for (lVar6 = local_90 << 4; lVar8 != lVar6; lVar6 = lVar6 + 0x10) {
          uVar3 = (this_00->current_constant).upper;
          *(uint64_t *)(local_98 + lVar6) = (this_00->current_constant).lower;
          *(uint64_t *)((long)(local_98 + lVar6) + 8) = uVar3;
        }
        uVar7 = 0x800 - iVar9;
        if (uVar11 < 0x800 - iVar9) {
          uVar7 = uVar11;
        }
      }
      else {
        uVar10 = (uint)iVar9 & 0x1f;
        size = (size_t)uVar10;
        uVar7 = 0x20 - size;
        if (uVar11 < 0x20 - size) {
          uVar7 = uVar11;
        }
        width = this_00->current_width;
        out = (uhugeint_t *)(local_98 + local_90 * 0x10);
        if (uVar7 == 0x20) {
          HugeIntPacker::Unpack
                    ((uint32_t *)
                     (this_00->current_group_ptr +
                     ((width * iVar9 >> 3) - (ulong)(width * uVar10 >> 3))),out,width);
        }
        else {
          HugeIntPacker::Unpack
                    ((uint32_t *)
                     (this_00->current_group_ptr +
                     ((width * iVar9 >> 3) - (ulong)(width * uVar10 >> 3))),local_a0,width);
          switchD_016b45db::default
                    (out,(void *)((long)&local_a0->lower + (ulong)(uVar10 << 4)),uVar7 << 4);
        }
        if ((this_00->current_group).mode == DELTA_FOR) {
          hVar14 = uhugeint_t::operator_cast_to_hugeint_t(this);
          frame_of_reference.lower = hVar14.upper;
          frame_of_reference.upper = uVar7;
          ApplyFrameOfReference<duckdb::hugeint_t>
                    ((duckdb *)out,(hugeint_t *)hVar14.lower,frame_of_reference,size);
          puVar4 = local_70;
          hVar14 = uhugeint_t::operator_cast_to_hugeint_t(local_70);
          previous_value.lower = hVar14.upper;
          previous_value.upper = uVar7;
          DeltaDecode<duckdb::hugeint_t>
                    ((duckdb *)out,(hugeint_t *)hVar14.lower,previous_value,size);
          uVar3 = out[uVar7 - 1].upper;
          puVar4->lower = out[uVar7 - 1].lower;
          puVar4->upper = uVar3;
        }
        else {
          local_b8 = *this;
          bVar5 = uhugeint_t::operator!(&local_b8);
          uVar11 = uVar7;
          if (!bVar5) {
            while (uVar11 != 0) {
              local_88.lower = local_b8.lower;
              local_88.upper = local_b8.upper;
              uhugeint_t::operator+=(out,&local_88);
              out = out + 1;
              uVar11 = uVar11 - 1;
            }
          }
        }
      }
      iVar9 = this_00->current_group_offset + uVar7;
    }
    this_00->current_group_offset = iVar9;
  }
  return;
}

Assistant:

void BitpackingScanPartial(ColumnSegment &segment, ColumnScanState &state, idx_t scan_count, Vector &result,
                           idx_t result_offset) {
	auto &scan_state = state.scan_state->Cast<BitpackingScanState<T>>();

	T *result_data = FlatVector::GetData<T>(result);
	result.SetVectorType(VectorType::FLAT_VECTOR);

	//! Because FOR offsets all our values to be 0 or above, we can always skip sign extension here
	bool skip_sign_extend = true;

	idx_t scanned = 0;
	while (scanned < scan_count) {
		D_ASSERT(scan_state.current_group_offset <= BITPACKING_METADATA_GROUP_SIZE);

		// Exhausted this metadata group, move pointers to next group and load metadata for next group.
		if (scan_state.current_group_offset == BITPACKING_METADATA_GROUP_SIZE) {
			scan_state.LoadNextGroup();
		}

		idx_t offset_in_compression_group =
		    scan_state.current_group_offset % BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE;

		if (scan_state.current_group.mode == BitpackingMode::CONSTANT) {
			idx_t remaining = scan_count - scanned;
			idx_t to_scan = MinValue(remaining, BITPACKING_METADATA_GROUP_SIZE - scan_state.current_group_offset);
			T *begin = result_data + result_offset + scanned;
			T *end = begin + remaining;
			std::fill(begin, end, scan_state.current_constant);
			scanned += to_scan;
			scan_state.current_group_offset += to_scan;
			continue;
		}
		if (scan_state.current_group.mode == BitpackingMode::CONSTANT_DELTA) {
			idx_t remaining = scan_count - scanned;
			idx_t to_scan = MinValue(remaining, BITPACKING_METADATA_GROUP_SIZE - scan_state.current_group_offset);
			T *target_ptr = result_data + result_offset + scanned;

			for (idx_t i = 0; i < to_scan; i++) {
				idx_t multiplier = scan_state.current_group_offset + i;
				// intended static casts to unsigned and back for defined wrapping of integers
				target_ptr[i] = static_cast<T>((static_cast<T_U>(scan_state.current_constant) * multiplier) +
				                               static_cast<T_U>(scan_state.current_frame_of_reference));
			}

			scanned += to_scan;
			scan_state.current_group_offset += to_scan;
			continue;
		}
		D_ASSERT(scan_state.current_group.mode == BitpackingMode::FOR ||
		         scan_state.current_group.mode == BitpackingMode::DELTA_FOR);

		idx_t to_scan = MinValue<idx_t>(scan_count - scanned, BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE -
		                                                          offset_in_compression_group);
		// Calculate start of compression algorithm group
		data_ptr_t current_position_ptr =
		    scan_state.current_group_ptr + scan_state.current_group_offset * scan_state.current_width / 8;
		data_ptr_t decompression_group_start_pointer =
		    current_position_ptr - offset_in_compression_group * scan_state.current_width / 8;

		T *current_result_ptr = result_data + result_offset + scanned;

		if (to_scan == BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE && offset_in_compression_group == 0) {
			// Decompress directly into result vector
			BitpackingPrimitives::UnPackBlock<T>(data_ptr_cast(current_result_ptr), decompression_group_start_pointer,
			                                     scan_state.current_width, skip_sign_extend);
		} else {
			// Decompress compression algorithm to buffer
			BitpackingPrimitives::UnPackBlock<T>(data_ptr_cast(scan_state.decompression_buffer),
			                                     decompression_group_start_pointer, scan_state.current_width,
			                                     skip_sign_extend);

			memcpy(current_result_ptr, scan_state.decompression_buffer + offset_in_compression_group,
			       to_scan * sizeof(T));
		}

		if (scan_state.current_group.mode == BitpackingMode::DELTA_FOR) {
			ApplyFrameOfReference<T_S>(reinterpret_cast<T_S *>(current_result_ptr),
			                           static_cast<T_S>(scan_state.current_frame_of_reference), to_scan);
			DeltaDecode<T_S>(reinterpret_cast<T_S *>(current_result_ptr),
			                 static_cast<T_S>(scan_state.current_delta_offset), to_scan);
			scan_state.current_delta_offset = current_result_ptr[to_scan - 1];
		} else {
			ApplyFrameOfReference<T>(current_result_ptr, scan_state.current_frame_of_reference, to_scan);
		}

		scanned += to_scan;
		scan_state.current_group_offset += to_scan;
	}
}